

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

unique_ptr<argo::json,_std::default_delete<argo::json>_> __thiscall
argo::parser::load(parser *this,string *file_name)

{
  bool bVar1;
  json_io_exception *this_00;
  int *piVar2;
  long local_220;
  ifstream is;
  string *file_name_local;
  
  std::ifstream::ifstream(&local_220,file_name,8);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if (!bVar1) {
    this_00 = (json_io_exception *)__cxa_allocate_exception(0xd8);
    piVar2 = __errno_location();
    json_io_exception::json_io_exception(this_00,file_open_failed_e,*piVar2);
    __cxa_throw(this_00,&json_io_exception::typeinfo,json_io_exception::~json_io_exception);
  }
  parse(this,(istream *)&local_220);
  std::ifstream::~ifstream(&local_220);
  return (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
         (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)this;
}

Assistant:

unique_ptr<json> parser::load(const string &file_name)
{
    ifstream is(file_name);

    if (is)
    {
        return parse(is);
    }
    else
    {
        throw json_io_exception(json_io_exception::file_open_failed_e, errno);
    }
}